

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::writeNames(WasmBinaryWriter *this)

{
  pointer puVar1;
  char *pcVar2;
  pointer pHVar3;
  BufferWithRandomAccess *pBVar4;
  pointer puVar5;
  Table *pTVar6;
  pointer puVar7;
  Memory *pMVar8;
  pointer puVar9;
  Global *pGVar10;
  pointer puVar11;
  ElementSegment *pEVar12;
  DataSegment *__n;
  pointer puVar13;
  Tag *__n_00;
  long lVar14;
  pointer ppVar15;
  bool bVar16;
  int32_t iVar17;
  HeapTypeKind HVar18;
  size_t sVar19;
  size_t sVar20;
  __node_base_ptr p_Var21;
  mapped_type *pmVar22;
  ulong uVar23;
  pointer ppVar24;
  const_iterator cVar25;
  mapped_type *pmVar26;
  mapped_type *pmVar27;
  iterator iVar28;
  Module *pMVar29;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *seg;
  WasmBinaryWriter *pWVar30;
  ulong uVar31;
  pointer __n_01;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  *__n_02;
  pointer puVar32;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *__buf_06;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *__buf_07;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *__buf_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *__buf_09;
  void *extraout_RDX_11;
  void *extraout_RDX_12;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *extraout_RDX_13;
  void *pvVar33;
  void *extraout_RDX_14;
  void *__buf_13;
  void *extraout_RDX_15;
  void *extraout_RDX_16;
  mapped_type mVar34;
  Function *pFVar35;
  uint uVar36;
  type *index;
  pointer pHVar37;
  size_type sVar38;
  iterator __begin2;
  pointer puVar39;
  pointer puVar40;
  pointer puVar41;
  pointer puVar42;
  pointer puVar43;
  pointer puVar44;
  Index index_00;
  int iVar45;
  iterator __end2;
  iterator iVar46;
  pointer puVar47;
  long *plVar48;
  iterator __begin2_2;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var49;
  undefined1 *puVar50;
  string_view name;
  pair<unsigned_int,_wasm::Name> local_a0;
  int32_t local_84;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_80;
  iterator __end2_2;
  vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  localsWithNames;
  pointer ppStack_58;
  vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  functionsWithNames;
  
  local_84 = startSection<wasm::BinaryConsts::Section>(this,Custom);
  pcVar2 = BinaryConsts::CustomSections::Name;
  sVar19 = strlen(BinaryConsts::CustomSections::Name);
  name._M_str = pcVar2;
  name._M_len = sVar19;
  writeInlineString(this,name);
  if ((this->emitModuleName == true) && ((this->wasm->name).super_IString.str._M_str != (char *)0x0)
     ) {
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameModule);
    writeEscapedName(this,(this->wasm->name).super_IString.str);
    finishSection(this,iVar17);
  }
  if (this->debugInfo == false) {
    finishSection(this,local_84);
    return;
  }
  ppStack_58 = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar39 = (this->wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar36 = 0;
  if (puVar39 != puVar1) {
    do {
      pFVar35 = (puVar39->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar35->super_Importable).module + 8) != (char *)0x0) {
        if (*(bool *)((long)&(pFVar35->super_Importable).super_Named + 0x10) == true) {
          __end2_2._M_current._0_4_ = uVar36;
          if (functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
            ::_M_realloc_insert<std::pair<unsigned_int,wasm::Function*>>
                      ((vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                        *)&ppStack_58,
                       (iterator)
                       functionsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pair<unsigned_int,_wasm::Function_*> *)&__end2_2);
          }
          else {
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pFVar35,0);
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pFVar35 >> 0x20);
            (functionsWithNames.
             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = uVar36;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = __end2_2._M_current._4_4_;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_;
            *(undefined4 *)
             ((long)&(functionsWithNames.
                      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_;
            functionsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        uVar36 = uVar36 + 1;
      }
      puVar39 = puVar39 + 1;
    } while (puVar39 != puVar1);
    puVar39 = (this->wasm->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar39 != puVar1) {
      do {
        pFVar35 = (puVar39->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar35->super_Importable).module + 8) == (char *)0x0) {
          if (*(bool *)((long)&(pFVar35->super_Importable).super_Named + 0x10) == true) {
            __end2_2._M_current._0_4_ = uVar36;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Function*>>
                        ((vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                          *)&ppStack_58,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Function_*> *)&__end2_2);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pFVar35,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pFVar35 >> 0x20)
              ;
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar36;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = __end2_2._M_current._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          uVar36 = uVar36 + 1;
        }
        puVar39 = puVar39 + 1;
      } while (puVar39 != puVar1);
    }
  }
  if ((this->indexes).functionIndexes._M_h._M_element_count != (ulong)uVar36) {
    __assert_fail("checked == indexes.functionIndexes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x385,"void wasm::WasmBinaryWriter::writeNames()");
  }
  if (functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != ppStack_58) {
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,DylinkMemInfo);
    __end2_2._M_current._0_4_ =
         (int)((ulong)((long)functionsWithNames.
                             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_58) >> 4);
    pWVar30 = this;
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,__buf,(size_t)this);
    ppVar15 = functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppStack_58 !=
        functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar33 = extraout_RDX;
      ppVar24 = ppStack_58;
      do {
        __end2_2._M_current._0_4_ = ppVar24->first;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,pvVar33,
                   (size_t)pWVar30);
        writeEscapedName(this,(ppVar24->second->super_Importable).super_Named.name.super_IString.str
                        );
        ppVar24 = ppVar24 + 1;
        pvVar33 = extraout_RDX_00;
      } while (ppVar24 != ppVar15);
    }
    finishSection(this,iVar17);
  }
  if (ppStack_58 != (pointer)0x0) {
    operator_delete(ppStack_58,
                    (long)functionsWithNames.
                          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_58);
  }
  ppStack_58 = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var49 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(this->wasm->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)(this->wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  uVar36 = 0;
  if (p_Var49 != local_80) {
    do {
      pFVar35 = (((__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>
                   *)&p_Var49->_M_buckets)->
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar35->super_Importable).module + 8) != (char *)0x0) {
        sVar20 = Function::getNumLocals(pFVar35);
        if (sVar20 != 0) {
          uVar31 = 0;
          do {
            bVar16 = Function::hasLocalName(pFVar35,(Index)uVar31);
            if (bVar16) {
              __end2_2._M_current._0_4_ = uVar36;
              if (functionsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  functionsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                ::_M_realloc_insert<std::pair<unsigned_int,wasm::Function*>>
                          ((vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                            *)&ppStack_58,
                           (iterator)
                           functionsWithNames.
                           super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (pair<unsigned_int,_wasm::Function_*> *)&__end2_2);
              }
              else {
                localsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pFVar35,0);
                localsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                     (undefined4)((ulong)pFVar35 >> 0x20);
                (functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first = uVar36;
                *(undefined4 *)
                 &(functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = __end2_2._M_current._4_4_
                ;
                *(undefined4 *)
                 &(functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second =
                     localsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_4_;
                *(undefined4 *)
                 ((long)&(functionsWithNames.
                          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                     localsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_;
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     functionsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
              }
              break;
            }
            uVar31 = (ulong)((Index)uVar31 + 1);
          } while (uVar31 < sVar20);
        }
        uVar36 = uVar36 + 1;
      }
      p_Var49 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&p_Var49->_M_bucket_count;
    } while (p_Var49 != local_80);
    p_Var49 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_80 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(this->wasm->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var49 != local_80) {
      do {
        pFVar35 = (((__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>
                     *)&p_Var49->_M_buckets)->
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar35->super_Importable).module + 8) == (char *)0x0) {
          sVar20 = Function::getNumLocals(pFVar35);
          if (sVar20 != 0) {
            uVar31 = 0;
            do {
              bVar16 = Function::hasLocalName(pFVar35,(Index)uVar31);
              if (bVar16) {
                __end2_2._M_current._0_4_ = uVar36;
                if (functionsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    functionsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::
                  vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                  ::_M_realloc_insert<std::pair<unsigned_int,wasm::Function*>>
                            ((vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                              *)&ppStack_58,
                             (iterator)
                             functionsWithNames.
                             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (pair<unsigned_int,_wasm::Function_*> *)&__end2_2);
                }
                else {
                  localsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pFVar35,0);
                  localsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                       (undefined4)((ulong)pFVar35 >> 0x20);
                  (functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first = uVar36;
                  *(undefined4 *)
                   &(functionsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->field_0x4 =
                       __end2_2._M_current._4_4_;
                  *(undefined4 *)
                   &(functionsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second =
                       localsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_;
                  *(undefined4 *)
                   ((long)&(functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                       localsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_;
                  functionsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       functionsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1;
                }
                break;
              }
              uVar31 = (ulong)((Index)uVar31 + 1);
            } while (uVar31 < sVar20);
          }
          uVar36 = uVar36 + 1;
        }
        p_Var49 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&p_Var49->_M_bucket_count;
      } while (p_Var49 != local_80);
    }
  }
  if ((this->indexes).functionIndexes._M_h._M_element_count != (ulong)uVar36) {
    __assert_fail("checked == indexes.functionIndexes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x3a4,"void wasm::WasmBinaryWriter::writeNames()");
  }
  if (functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != ppStack_58) {
    pWVar30 = this;
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,DylinkNeeded);
    __end2_2._M_current._0_4_ =
         (int)((ulong)((long)functionsWithNames.
                             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_58) >> 4);
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,__buf_00,(size_t)pWVar30);
    ppVar15 = functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar31 = 0;
    ppVar24 = ppStack_58;
    if (ppStack_58 !=
        functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_80 = &(this->funcMappedLocals)._M_h;
      do {
        __end2_2._M_current =
             (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)0x0;
        localsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sVar20 = Function::getNumLocals(ppVar24->second);
        if (sVar20 != 0) {
          uVar23 = 0;
          do {
            index_00 = (Index)uVar23;
            bVar16 = Function::hasLocalName(ppVar24->second,index_00);
            if (bVar16) {
              pcVar2 = (ppVar24->second->super_Importable).super_Named.name.super_IString.str._M_str
              ;
              p_Var21 = std::
                        _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::_M_find_before_node
                                  (local_80,(ulong)pcVar2 %
                                            (this->funcMappedLocals)._M_h._M_bucket_count,
                                   (key_type *)ppVar24->second,(__hash_code)pcVar2);
              if ((p_Var21 == (__node_base_ptr)0x0) || (p_Var21->_M_nxt == (_Hash_node_base *)0x0))
              {
                pFVar35 = ppVar24->second;
                mVar34 = index_00;
                if ((pFVar35->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
                  __assert_fail("func->imported()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                                ,0x3bb,"void wasm::WasmBinaryWriter::writeNames()");
                }
              }
              else {
                local_a0._4_4_ = 0;
                local_a0.first = index_00;
                pmVar22 = std::__detail::
                          _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)(p_Var21->_M_nxt + 3),(key_type *)&local_a0);
                pFVar35 = ppVar24->second;
                mVar34 = (mapped_type)*pmVar22;
              }
              local_a0.second = Function::getLocalName(pFVar35,index_00);
              local_a0.first = mVar34;
              if (localsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                std::
                vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>
                ::_M_realloc_insert<std::pair<unsigned_int,wasm::Name>>
                          ((vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>
                            *)&__end2_2,(iterator)0x0,&local_a0);
              }
              else {
                ((localsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->second).super_IString.str._M_str =
                     local_a0.second.super_IString.str._M_str;
                *(ulong *)localsWithNames.
                          super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                     CONCAT44(local_a0._4_4_,mVar34);
                ((localsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->second).super_IString.str._M_len =
                     local_a0.second.super_IString.str._M_len;
                localsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     localsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
              }
            }
            uVar23 = (ulong)(index_00 + 1);
          } while (uVar23 < sVar20);
        }
        iVar46._M_current = __end2_2._M_current;
        if ((long)localsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_start - (long)__end2_2._M_current == 0) {
          __assert_fail("localsWithNames.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                        ,0x3c2,"void wasm::WasmBinaryWriter::writeNames()");
        }
        sVar19 = 0xaaaaaaaaaaaaaaab;
        uVar23 = ((long)localsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)__end2_2._M_current >> 3)
                 * -0x5555555555555555;
        lVar14 = 0x3f;
        if (uVar23 != 0) {
          for (; uVar23 >> lVar14 == 0; lVar14 = lVar14 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,wasm::Name>*,std::vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (__end2_2._M_current,
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,wasm::Name>*,std::vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (iVar46._M_current,
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        local_a0.first = ppVar24->first;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)&local_a0,(int)this->o,__buf_01,sVar19);
        local_a0.first =
             (int)((ulong)((long)localsWithNames.
                                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                          (long)__end2_2._M_current) >> 3) * -0x55555555;
        pWVar30 = this;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)&local_a0,(int)this->o,__buf_02,(size_t)this)
        ;
        pvVar33 = extraout_RDX_01;
        for (iVar46 = __end2_2;
            (pointer)iVar46._M_current !=
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
            iVar46._M_current =
                 (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                 ((long)iVar46._M_current + 0x18)) {
          local_a0.first =
               *(uint *)&(((__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>
                            *)&((pointer)iVar46._M_current)->first)->
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         )._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)&local_a0,(int)this->o,pvVar33,
                     (size_t)pWVar30);
          writeEscapedName(this,(((pointer)iVar46._M_current)->second).super_IString.str);
          pvVar33 = extraout_RDX_02;
        }
        if (__end2_2._M_current !=
            (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)0x0) {
          operator_delete(__end2_2._M_current,-(long)__end2_2._M_current);
        }
        uVar36 = (int)uVar31 + 1;
        uVar31 = (ulong)uVar36;
        ppVar24 = ppVar24 + 1;
      } while (ppVar24 != ppVar15);
      uVar31 = (ulong)uVar36;
      ppVar24 = functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    if ((long)ppVar24 - (long)ppStack_58 >> 4 != uVar31) {
      __assert_fail("emitted == functionsWithLocalNames.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x3cc,"void wasm::WasmBinaryWriter::writeNames()");
    }
    finishSection(this,iVar17);
  }
  if (ppStack_58 != (pointer)0x0) {
    operator_delete(ppStack_58,
                    (long)functionsWithNames.
                          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_58);
  }
  ppStack_58 = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pHVar37 = (this->indexedTypes).types.
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start;
  pHVar3 = (this->indexedTypes).types.
           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar37 != pHVar3) {
    do {
      __end2_2._M_current =
           (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)pHVar37->id;
      cVar25 = std::
               _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&(this->wasm->typeNames)._M_h,(key_type *)&__end2_2);
      if ((cVar25.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
           _M_cur != (__node_type *)0x0) &&
         (pmVar26 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->wasm->typeNames,(key_type *)&__end2_2),
         (pmVar26->name).super_IString.str._M_str != (char *)0x0)) {
        if (functionsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            functionsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&ppStack_58,
                     (iterator)
                     functionsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(HeapType *)&__end2_2);
        }
        else {
          *(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> **)
           functionsWithNames.
           super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start = __end2_2._M_current;
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&(functionsWithNames.
                          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->second;
        }
      }
      pHVar37 = pHVar37 + 1;
    } while (pHVar37 != pHVar3);
    if (ppStack_58 !=
        functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameType);
      __end2_2._M_current._0_4_ =
           (int)((ulong)((long)functionsWithNames.
                               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_58) >> 3);
      pWVar30 = this;
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,__buf_03,(size_t)this);
      ppVar15 = functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppStack_58 !=
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        ppVar24 = ppStack_58;
        do {
          __end2_2._M_current =
               *(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> **)ppVar24;
          pBVar4 = this->o;
          pmVar27 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&(this->indexedTypes).indices,(key_type *)&__end2_2);
          local_a0.first = *pmVar27;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)&local_a0,(int)pBVar4,__buf_04,
                     (size_t)pWVar30);
          pmVar26 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->wasm->typeNames,(key_type *)&__end2_2);
          writeEscapedName(this,(pmVar26->name).super_IString.str);
          ppVar24 = (pointer)&ppVar24->second;
        } while (ppVar24 != ppVar15);
      }
      finishSection(this,iVar17);
    }
    if (ppStack_58 != (pointer)0x0) {
      operator_delete(ppStack_58,
                      (long)functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_58);
    }
  }
  ppStack_58 = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar40 = (this->wasm->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar38 = 0;
  if (puVar40 != puVar5) {
    do {
      pTVar6 = (puVar40->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
               ._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
               super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      if (*(char **)((long)&(pTVar6->super_Importable).module + 8) != (char *)0x0) {
        uVar36 = (uint)sVar38;
        if (*(bool *)((long)&(pTVar6->super_Importable).super_Named + 0x10) == true) {
          __end2_2._M_current._0_4_ = uVar36;
          if (functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::pair<unsigned_int,wasm::Table*>,std::allocator<std::pair<unsigned_int,wasm::Table*>>>
            ::_M_realloc_insert<std::pair<unsigned_int,wasm::Table*>>
                      ((vector<std::pair<unsigned_int,wasm::Table*>,std::allocator<std::pair<unsigned_int,wasm::Table*>>>
                        *)&ppStack_58,
                       (iterator)
                       functionsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pair<unsigned_int,_wasm::Table_*> *)&__end2_2);
          }
          else {
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pTVar6,0);
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pTVar6 >> 0x20);
            (functionsWithNames.
             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = uVar36;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = __end2_2._M_current._4_4_;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_;
            *(undefined4 *)
             ((long)&(functionsWithNames.
                      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_;
            functionsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        sVar38 = (size_type)(uVar36 + 1);
      }
      puVar40 = puVar40 + 1;
    } while (puVar40 != puVar5);
    puVar40 = (this->wasm->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this->wasm->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar40 != puVar5) {
      do {
        pTVar6 = (puVar40->_M_t).
                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                 super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
        if (*(char **)((long)&(pTVar6->super_Importable).module + 8) == (char *)0x0) {
          uVar36 = (uint)sVar38;
          if (*(bool *)((long)&(pTVar6->super_Importable).super_Named + 0x10) == true) {
            __end2_2._M_current._0_4_ = uVar36;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Table*>,std::allocator<std::pair<unsigned_int,wasm::Table*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Table*>>
                        ((vector<std::pair<unsigned_int,wasm::Table*>,std::allocator<std::pair<unsigned_int,wasm::Table*>>>
                          *)&ppStack_58,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Table_*> *)&__end2_2);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pTVar6,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pTVar6 >> 0x20);
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar36;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = __end2_2._M_current._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          sVar38 = (size_type)(uVar36 + 1);
        }
        puVar40 = puVar40 + 1;
      } while (puVar40 != puVar5);
    }
  }
  if ((this->indexes).tableIndexes._M_h._M_element_count != sVar38) {
    __assert_fail("checked == indexes.tableIndexes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x3f1,"void wasm::WasmBinaryWriter::writeNames()");
  }
  if (functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != ppStack_58) {
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameTable);
    __end2_2._M_current._0_4_ =
         (int)((ulong)((long)functionsWithNames.
                             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_58) >> 4);
    pWVar30 = this;
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,__buf_05,(size_t)this);
    ppVar15 = functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppStack_58 !=
        functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar33 = extraout_RDX_03;
      ppVar24 = ppStack_58;
      do {
        __end2_2._M_current._0_4_ = ppVar24->first;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,pvVar33,
                   (size_t)pWVar30);
        writeEscapedName(this,(ppVar24->second->super_Importable).super_Named.name.super_IString.str
                        );
        ppVar24 = ppVar24 + 1;
        pvVar33 = extraout_RDX_04;
      } while (ppVar24 != ppVar15);
    }
    finishSection(this,iVar17);
  }
  if (ppStack_58 != (pointer)0x0) {
    operator_delete(ppStack_58,
                    (long)functionsWithNames.
                          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_58);
  }
  ppStack_58 = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar41 = (this->wasm->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = (this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar38 = 0;
  if (puVar41 != puVar7) {
    do {
      pMVar8 = (puVar41->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      if (*(char **)((long)&(pMVar8->super_Importable).module + 8) != (char *)0x0) {
        uVar36 = (uint)sVar38;
        if (*(bool *)((long)&(pMVar8->super_Importable).super_Named + 0x10) == true) {
          __end2_2._M_current._0_4_ = uVar36;
          if (functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::pair<unsigned_int,wasm::Memory*>,std::allocator<std::pair<unsigned_int,wasm::Memory*>>>
            ::_M_realloc_insert<std::pair<unsigned_int,wasm::Memory*>>
                      ((vector<std::pair<unsigned_int,wasm::Memory*>,std::allocator<std::pair<unsigned_int,wasm::Memory*>>>
                        *)&ppStack_58,
                       (iterator)
                       functionsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pair<unsigned_int,_wasm::Memory_*> *)&__end2_2);
          }
          else {
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pMVar8,0);
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pMVar8 >> 0x20);
            (functionsWithNames.
             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = uVar36;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = __end2_2._M_current._4_4_;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_;
            *(undefined4 *)
             ((long)&(functionsWithNames.
                      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_;
            functionsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        sVar38 = (size_type)(uVar36 + 1);
      }
      puVar41 = puVar41 + 1;
    } while (puVar41 != puVar7);
    puVar41 = (this->wasm->memories).
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar41 != puVar7) {
      do {
        pMVar8 = (puVar41->_M_t).
                 super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        if (*(char **)((long)&(pMVar8->super_Importable).module + 8) == (char *)0x0) {
          uVar36 = (uint)sVar38;
          if (*(bool *)((long)&(pMVar8->super_Importable).super_Named + 0x10) == true) {
            __end2_2._M_current._0_4_ = uVar36;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Memory*>,std::allocator<std::pair<unsigned_int,wasm::Memory*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Memory*>>
                        ((vector<std::pair<unsigned_int,wasm::Memory*>,std::allocator<std::pair<unsigned_int,wasm::Memory*>>>
                          *)&ppStack_58,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Memory_*> *)&__end2_2);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pMVar8,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pMVar8 >> 0x20);
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar36;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = __end2_2._M_current._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          sVar38 = (size_type)(uVar36 + 1);
        }
        puVar41 = puVar41 + 1;
      } while (puVar41 != puVar7);
    }
  }
  if ((this->indexes).memoryIndexes._M_h._M_element_count != sVar38) {
    __assert_fail("checked == indexes.memoryIndexes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x40d,"void wasm::WasmBinaryWriter::writeNames()");
  }
  if (functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != ppStack_58) {
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameMemory);
    __end2_2._M_current._0_4_ =
         (int)((ulong)((long)functionsWithNames.
                             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_58) >> 4);
    pWVar30 = this;
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,__buf_06,(size_t)this);
    ppVar15 = functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppStack_58 !=
        functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar33 = extraout_RDX_05;
      ppVar24 = ppStack_58;
      do {
        __end2_2._M_current._0_4_ = ppVar24->first;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,pvVar33,
                   (size_t)pWVar30);
        writeEscapedName(this,(ppVar24->second->super_Importable).super_Named.name.super_IString.str
                        );
        ppVar24 = ppVar24 + 1;
        pvVar33 = extraout_RDX_06;
      } while (ppVar24 != ppVar15);
    }
    finishSection(this,iVar17);
  }
  if (ppStack_58 != (pointer)0x0) {
    operator_delete(ppStack_58,
                    (long)functionsWithNames.
                          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_58);
  }
  ppStack_58 = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar42 = (this->wasm->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar38 = 0;
  if (puVar42 != puVar9) {
    do {
      pGVar10 = (puVar42->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar10->super_Importable).module + 8) != (char *)0x0) {
        uVar36 = (uint)sVar38;
        if (*(bool *)((long)&(pGVar10->super_Importable).super_Named + 0x10) == true) {
          __end2_2._M_current._0_4_ = uVar36;
          if (functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::pair<unsigned_int,wasm::Global*>,std::allocator<std::pair<unsigned_int,wasm::Global*>>>
            ::_M_realloc_insert<std::pair<unsigned_int,wasm::Global*>>
                      ((vector<std::pair<unsigned_int,wasm::Global*>,std::allocator<std::pair<unsigned_int,wasm::Global*>>>
                        *)&ppStack_58,
                       (iterator)
                       functionsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pair<unsigned_int,_wasm::Global_*> *)&__end2_2);
          }
          else {
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pGVar10,0);
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pGVar10 >> 0x20);
            (functionsWithNames.
             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = uVar36;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = __end2_2._M_current._4_4_;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_;
            *(undefined4 *)
             ((long)&(functionsWithNames.
                      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_;
            functionsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        sVar38 = (size_type)(uVar36 + 1);
      }
      puVar42 = puVar42 + 1;
    } while (puVar42 != puVar9);
    puVar42 = (this->wasm->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar9 = (this->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar42 != puVar9) {
      do {
        pGVar10 = (puVar42->_M_t).
                  super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar10->super_Importable).module + 8) == (char *)0x0) {
          uVar36 = (uint)sVar38;
          if (*(bool *)((long)&(pGVar10->super_Importable).super_Named + 0x10) == true) {
            __end2_2._M_current._0_4_ = uVar36;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Global*>,std::allocator<std::pair<unsigned_int,wasm::Global*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Global*>>
                        ((vector<std::pair<unsigned_int,wasm::Global*>,std::allocator<std::pair<unsigned_int,wasm::Global*>>>
                          *)&ppStack_58,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Global_*> *)&__end2_2);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pGVar10,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pGVar10 >> 0x20)
              ;
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar36;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = __end2_2._M_current._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          sVar38 = (size_type)(uVar36 + 1);
        }
        puVar42 = puVar42 + 1;
      } while (puVar42 != puVar9);
    }
  }
  if ((this->indexes).globalIndexes._M_h._M_element_count == sVar38) {
    if (functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != ppStack_58) {
      iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameGlobal);
      __end2_2._M_current._0_4_ =
           (int)((ulong)((long)functionsWithNames.
                               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_58) >> 4);
      pWVar30 = this;
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,__buf_07,(size_t)this);
      ppVar15 = functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppStack_58 !=
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar33 = extraout_RDX_07;
        ppVar24 = ppStack_58;
        do {
          __end2_2._M_current._0_4_ = ppVar24->first;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,pvVar33,
                     (size_t)pWVar30);
          writeEscapedName(this,(ppVar24->second->super_Importable).super_Named.name.super_IString.
                                str);
          ppVar24 = ppVar24 + 1;
          pvVar33 = extraout_RDX_08;
        } while (ppVar24 != ppVar15);
      }
      finishSection(this,iVar17);
    }
    if (ppStack_58 != (pointer)0x0) {
      operator_delete(ppStack_58,
                      (long)functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_58);
    }
    ppStack_58 = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar43 = (this->wasm->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar11 = (this->wasm->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sVar38 = 0;
    if (puVar43 != puVar11) {
      do {
        pEVar12 = (puVar43->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        uVar36 = (uint)sVar38;
        if ((pEVar12->super_Named).hasExplicitName == true) {
          __end2_2._M_current._0_4_ = uVar36;
          if (functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::pair<unsigned_int,wasm::ElementSegment*>,std::allocator<std::pair<unsigned_int,wasm::ElementSegment*>>>
            ::_M_realloc_insert<std::pair<unsigned_int,wasm::ElementSegment*>>
                      ((vector<std::pair<unsigned_int,wasm::ElementSegment*>,std::allocator<std::pair<unsigned_int,wasm::ElementSegment*>>>
                        *)&ppStack_58,
                       (iterator)
                       functionsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pair<unsigned_int,_wasm::ElementSegment_*> *)&__end2_2);
          }
          else {
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pEVar12,0);
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pEVar12 >> 0x20);
            (functionsWithNames.
             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = uVar36;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = __end2_2._M_current._4_4_;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_;
            *(undefined4 *)
             ((long)&(functionsWithNames.
                      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_;
            functionsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        sVar38 = (size_type)(uVar36 + 1);
        puVar43 = puVar43 + 1;
      } while (puVar43 != puVar11);
      sVar38 = (size_type)(uVar36 + 1);
    }
    if ((this->indexes).elemIndexes._M_h._M_element_count == sVar38) {
      if (functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != ppStack_58) {
        iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameElem);
        __end2_2._M_current._0_4_ =
             (int)((ulong)((long)functionsWithNames.
                                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_58) >> 4)
        ;
        pWVar30 = this;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,__buf_08,(size_t)this)
        ;
        ppVar15 = functionsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppStack_58 !=
            functionsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pvVar33 = extraout_RDX_09;
          ppVar24 = ppStack_58;
          do {
            __end2_2._M_current._0_4_ = ppVar24->first;
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,pvVar33,
                       (size_t)pWVar30);
            writeEscapedName(this,(ppVar24->second->super_Importable).super_Named.name.super_IString
                                  .str);
            ppVar24 = ppVar24 + 1;
            pvVar33 = extraout_RDX_10;
          } while (ppVar24 != ppVar15);
        }
        finishSection(this,iVar17);
      }
      if (ppStack_58 != (pointer)0x0) {
        operator_delete(ppStack_58,
                        (long)functionsWithNames.
                              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_58);
      }
      pMVar29 = this->wasm;
      __n_01 = (pMVar29->dataSegments).
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar44 = (pMVar29->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (__n_01 != puVar44) {
        iVar45 = 0;
        do {
          iVar45 = iVar45 + (uint)(((__n_01->_M_t).
                                    super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                    .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)
                                  ->super_Named).hasExplicitName;
          __n_01 = __n_01 + 1;
        } while (__n_01 != puVar44);
        if (iVar45 != 0) {
          iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameData);
          local_80 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)CONCAT44(local_80._4_4_,iVar17);
          ppStack_58 = (pointer)CONCAT44(ppStack_58._4_4_,iVar45);
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)&ppStack_58,(int)this->o,__buf_09,
                     (size_t)__n_01);
          pMVar29 = this->wasm;
          puVar44 = (pMVar29->dataSegments).
                    super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pMVar29->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != puVar44) {
            uVar36 = 1;
            puVar47 = (pointer)0x0;
            pvVar33 = extraout_RDX_11;
            do {
              __n = puVar44[(long)puVar47]._M_t.
                    super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                    .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
              if ((__n->super_Named).hasExplicitName == true) {
                ppStack_58 = (pointer)CONCAT44(ppStack_58._4_4_,uVar36 - 1);
                LEB<unsigned_int,_unsigned_char>::write
                          ((LEB<unsigned_int,_unsigned_char> *)&ppStack_58,(int)this->o,pvVar33,
                           (size_t)__n);
                writeEscapedName(this,*(string_view *)
                                       &((puVar44[(long)puVar47]._M_t.
                                          super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                          .super__Head_base<0UL,_wasm::DataSegment_*,_false>.
                                         _M_head_impl)->super_Named).name);
                pMVar29 = this->wasm;
                pvVar33 = extraout_RDX_12;
              }
              puVar47 = (pointer)(ulong)uVar36;
              puVar44 = (pMVar29->dataSegments).
                        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              __n_01 = (pointer)((long)(pMVar29->dataSegments).
                                       super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar44 >>
                                3);
              uVar36 = uVar36 + 1;
            } while (puVar47 < __n_01);
          }
          finishSection(this,(int32_t)local_80);
          pMVar29 = this->wasm;
        }
      }
      if (((pMVar29->features).features & 0x400) != 0) {
        ppStack_58 = (pointer)0x0;
        functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pHVar37 = (this->indexedTypes).types.
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pHVar3 = (this->indexedTypes).types.
                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pHVar37 != pHVar3) {
          do {
            HVar18 = HeapType::getKind(pHVar37);
            if (((HVar18 == Struct) &&
                (cVar25 = std::
                          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::find(&(this->wasm->typeNames)._M_h,pHVar37),
                cVar25.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
                _M_cur != (__node_type *)0x0)) &&
               (pmVar26 = std::__detail::
                          _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&this->wasm->typeNames,pHVar37),
               (pmVar26->fieldNames)._M_h._M_element_count != 0)) {
              if (functionsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  functionsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
                _M_realloc_insert<wasm::HeapType_const&>
                          ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&ppStack_58,
                           (iterator)
                           functionsWithNames.
                           super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,pHVar37);
              }
              else {
                *(uintptr_t *)
                 functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start = pHVar37->id;
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)&(functionsWithNames.
                                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->second;
              }
            }
            pHVar37 = pHVar37 + 1;
          } while (pHVar37 != pHVar3);
          if (ppStack_58 !=
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameField);
            __end2_2._M_current._0_4_ =
                 (int)((ulong)((long)functionsWithNames.
                                     super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_58)
                      >> 3);
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)&__end2_2,(int)this->o,__buf_10,
                       (size_t)__n_01);
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start != ppStack_58) {
              __n_02 = &(this->indexedTypes).indices;
              puVar50 = (undefined1 *)0x0;
              local_80 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)__n_02;
              do {
                __end2_2._M_current =
                     *(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> **)
                      (&ppStack_58->first + (long)puVar50 * 2);
                pBVar4 = this->o;
                pmVar27 = std::__detail::
                          _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)local_80,(key_type *)&__end2_2);
                local_a0.first = *pmVar27;
                LEB<unsigned_int,_unsigned_char>::write
                          ((LEB<unsigned_int,_unsigned_char> *)&local_a0,(int)pBVar4,__buf_11,
                           (size_t)__n_02);
                iVar28 = std::
                         _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find(&(this->wasm->typeNames)._M_h,(key_type *)&__end2_2);
                if (iVar28.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  std::__throw_out_of_range("_Map_base::at");
                }
                local_a0.first =
                     *(mapped_type *)
                      ((long)iVar28.
                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                             ._M_cur + 0x38);
                LEB<unsigned_int,_unsigned_char>::write
                          ((LEB<unsigned_int,_unsigned_char> *)&local_a0,(int)this->o,__buf_12,
                           (size_t)__n_02);
                plVar48 = (long *)((long)iVar28.
                                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                         ._M_cur + 0x30);
                pvVar33 = extraout_RDX_13;
                while (plVar48 = (long *)*plVar48, plVar48 != (long *)0x0) {
                  local_a0.first = *(uint *)(plVar48 + 1);
                  LEB<unsigned_int,_unsigned_char>::write
                            ((LEB<unsigned_int,_unsigned_char> *)&local_a0,(int)this->o,pvVar33,
                             (size_t)__n_02);
                  writeEscapedName(this,*(string_view *)(plVar48 + 2));
                  pvVar33 = extraout_RDX_14;
                }
                puVar50 = (undefined1 *)(ulong)((int)puVar50 + 1);
                __n_02 = (unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                          *)((long)functionsWithNames.
                                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_58 >> 3
                            );
              } while (puVar50 < __n_02);
            }
            finishSection(this,iVar17);
          }
          if (ppStack_58 != (pointer)0x0) {
            operator_delete(ppStack_58,
                            (long)functionsWithNames.
                                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_58);
          }
        }
        pMVar29 = this->wasm;
      }
      puVar32 = (pMVar29->tags).
                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar13 = (pMVar29->tags).
                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar32 != puVar13) {
        iVar45 = 0;
        do {
          iVar45 = iVar45 + (uint)*(bool *)((long)&(((puVar32->_M_t).
                                                                                                          
                                                  super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                                  .super__Head_base<0UL,_wasm::Tag_*,_false>.
                                                  _M_head_impl)->super_Importable).super_Named +
                                           0x10);
          puVar32 = puVar32 + 1;
        } while (puVar32 != puVar13);
        if (iVar45 != 0) {
          iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameTag);
          local_80 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)CONCAT44(local_80._4_4_,iVar17);
          ppStack_58 = (pointer)CONCAT44(ppStack_58._4_4_,iVar45);
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)&ppStack_58,(int)this->o,__buf_13,
                     (size_t)puVar32);
          pMVar29 = this->wasm;
          puVar32 = (pMVar29->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pMVar29->tags).
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != puVar32) {
            uVar36 = 1;
            uVar31 = 0;
            pvVar33 = extraout_RDX_15;
            do {
              __n_00 = puVar32[uVar31]._M_t.
                       super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                       super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
              if (*(bool *)((long)&(__n_00->super_Importable).super_Named + 0x10) == true) {
                ppStack_58 = (pointer)CONCAT44(ppStack_58._4_4_,uVar36 - 1);
                LEB<unsigned_int,_unsigned_char>::write
                          ((LEB<unsigned_int,_unsigned_char> *)&ppStack_58,(int)this->o,pvVar33,
                           (size_t)__n_00);
                writeEscapedName(this,*(string_view *)
                                       &((puVar32[uVar31]._M_t.
                                          super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                          .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)->
                                        super_Importable).super_Named);
                pMVar29 = this->wasm;
                pvVar33 = extraout_RDX_16;
              }
              uVar31 = (ulong)uVar36;
              puVar32 = (pMVar29->tags).
                        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar36 = uVar36 + 1;
            } while (uVar31 < (ulong)((long)(pMVar29->tags).
                                            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)puVar32 >> 3));
          }
          finishSection(this,(int32_t)local_80);
        }
      }
      finishSection(this,local_84);
      return;
    }
    __assert_fail("checked == indexes.elemIndexes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x43d,"void wasm::WasmBinaryWriter::writeNames()");
  }
  __assert_fail("checked == indexes.globalIndexes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                ,0x426,"void wasm::WasmBinaryWriter::writeNames()");
}

Assistant:

void WasmBinaryWriter::writeNames() {
  auto start = startSection(BinaryConsts::Section::Custom);
  writeInlineString(BinaryConsts::CustomSections::Name);

  // module name
  if (emitModuleName && wasm->name.is()) {
    auto substart =
      startSubsection(BinaryConsts::CustomSections::Subsection::NameModule);
    writeEscapedName(wasm->name.str);
    finishSubsection(substart);
  }

  if (!debugInfo) {
    // We were only writing the module name.
    finishSection(start);
    return;
  }

  // function names
  {
    std::vector<std::pair<Index, Function*>> functionsWithNames;
    Index checked = 0;
    auto check = [&](Function* curr) {
      if (curr->hasExplicitName) {
        functionsWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedFunctions(*wasm, check);
    ModuleUtils::iterDefinedFunctions(*wasm, check);
    assert(checked == indexes.functionIndexes.size());
    if (functionsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameFunction);
      o << U32LEB(functionsWithNames.size());
      for (auto& [index, global] : functionsWithNames) {
        o << U32LEB(index);
        writeEscapedName(global->name.str);
      }
      finishSubsection(substart);
    }
  }

  // local names
  {
    // Find all functions with at least one local name and only emit the
    // subsection if there is at least one.
    std::vector<std::pair<Index, Function*>> functionsWithLocalNames;
    Index checked = 0;
    auto check = [&](Function* curr) {
      auto numLocals = curr->getNumLocals();
      for (Index i = 0; i < numLocals; ++i) {
        if (curr->hasLocalName(i)) {
          functionsWithLocalNames.push_back({checked, curr});
          break;
        }
      }
      checked++;
    };
    ModuleUtils::iterImportedFunctions(*wasm, check);
    ModuleUtils::iterDefinedFunctions(*wasm, check);
    assert(checked == indexes.functionIndexes.size());
    if (functionsWithLocalNames.size() > 0) {
      // Otherwise emit those functions but only include locals with a name.
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameLocal);
      o << U32LEB(functionsWithLocalNames.size());
      Index emitted = 0;
      for (auto& [index, func] : functionsWithLocalNames) {
        // Pairs of (local index in IR, name).
        std::vector<std::pair<Index, Name>> localsWithNames;
        auto numLocals = func->getNumLocals();
        for (Index indexInFunc = 0; indexInFunc < numLocals; ++indexInFunc) {
          if (func->hasLocalName(indexInFunc)) {
            Index indexInBinary;
            auto iter = funcMappedLocals.find(func->name);
            if (iter != funcMappedLocals.end()) {
              // TODO: handle multivalue
              indexInBinary = iter->second[{indexInFunc, 0}];
            } else {
              // No data on funcMappedLocals. That is only possible if we are an
              // imported function, where there are no locals to map, and in
              // that case the index is unchanged anyhow: parameters always have
              // the same index, they are not mapped in any way.
              assert(func->imported());
              indexInBinary = indexInFunc;
            }
            localsWithNames.push_back(
              {indexInBinary, func->getLocalName(indexInFunc)});
          }
        }
        assert(localsWithNames.size());
        std::sort(localsWithNames.begin(), localsWithNames.end());
        o << U32LEB(index);
        o << U32LEB(localsWithNames.size());
        for (auto& [indexInBinary, name] : localsWithNames) {
          o << U32LEB(indexInBinary);
          writeEscapedName(name.str);
        }
        emitted++;
      }
      assert(emitted == functionsWithLocalNames.size());
      finishSubsection(substart);
    }
  }

  // type names
  {
    std::vector<HeapType> namedTypes;
    for (auto type : indexedTypes.types) {
      if (wasm->typeNames.count(type) && wasm->typeNames[type].name.is()) {
        namedTypes.push_back(type);
      }
    }
    if (!namedTypes.empty()) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameType);
      o << U32LEB(namedTypes.size());
      for (auto type : namedTypes) {
        o << U32LEB(indexedTypes.indices[type]);
        writeEscapedName(wasm->typeNames[type].name.str);
      }
      finishSubsection(substart);
    }
  }

  // table names
  {
    std::vector<std::pair<Index, Table*>> tablesWithNames;
    Index checked = 0;
    auto check = [&](Table* curr) {
      if (curr->hasExplicitName) {
        tablesWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedTables(*wasm, check);
    ModuleUtils::iterDefinedTables(*wasm, check);
    assert(checked == indexes.tableIndexes.size());

    if (tablesWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameTable);
      o << U32LEB(tablesWithNames.size());

      for (auto& [index, table] : tablesWithNames) {
        o << U32LEB(index);
        writeEscapedName(table->name.str);
      }

      finishSubsection(substart);
    }
  }

  // memory names
  {
    std::vector<std::pair<Index, Memory*>> memoriesWithNames;
    Index checked = 0;
    auto check = [&](Memory* curr) {
      if (curr->hasExplicitName) {
        memoriesWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedMemories(*wasm, check);
    ModuleUtils::iterDefinedMemories(*wasm, check);
    assert(checked == indexes.memoryIndexes.size());
    if (memoriesWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameMemory);
      o << U32LEB(memoriesWithNames.size());
      for (auto& [index, memory] : memoriesWithNames) {
        o << U32LEB(index);
        writeEscapedName(memory->name.str);
      }
      finishSubsection(substart);
    }
  }

  // global names
  {
    std::vector<std::pair<Index, Global*>> globalsWithNames;
    Index checked = 0;
    auto check = [&](Global* curr) {
      if (curr->hasExplicitName) {
        globalsWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedGlobals(*wasm, check);
    ModuleUtils::iterDefinedGlobals(*wasm, check);
    assert(checked == indexes.globalIndexes.size());
    if (globalsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameGlobal);
      o << U32LEB(globalsWithNames.size());
      for (auto& [index, global] : globalsWithNames) {
        o << U32LEB(index);
        writeEscapedName(global->name.str);
      }
      finishSubsection(substart);
    }
  }

  // elem segment names
  {
    std::vector<std::pair<Index, ElementSegment*>> elemsWithNames;
    Index checked = 0;
    for (auto& curr : wasm->elementSegments) {
      if (curr->hasExplicitName) {
        elemsWithNames.push_back({checked, curr.get()});
      }
      checked++;
    }
    assert(checked == indexes.elemIndexes.size());

    if (elemsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameElem);
      o << U32LEB(elemsWithNames.size());

      for (auto& [index, elem] : elemsWithNames) {
        o << U32LEB(index);
        writeEscapedName(elem->name.str);
      }

      finishSubsection(substart);
    }
  }

  // data segment names
  {
    Index count = 0;
    for (auto& seg : wasm->dataSegments) {
      if (seg->hasExplicitName) {
        count++;
      }
    }

    if (count) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameData);
      o << U32LEB(count);
      for (Index i = 0; i < wasm->dataSegments.size(); i++) {
        auto& seg = wasm->dataSegments[i];
        if (seg->hasExplicitName) {
          o << U32LEB(i);
          writeEscapedName(seg->name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  // TODO: label, type, and element names
  // see: https://github.com/WebAssembly/extended-name-section

  // GC field names
  if (wasm->features.hasGC()) {
    std::vector<HeapType> relevantTypes;
    for (auto& type : indexedTypes.types) {
      if (type.isStruct() && wasm->typeNames.count(type) &&
          !wasm->typeNames[type].fieldNames.empty()) {
        relevantTypes.push_back(type);
      }
    }
    if (!relevantTypes.empty()) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameField);
      o << U32LEB(relevantTypes.size());
      for (Index i = 0; i < relevantTypes.size(); i++) {
        auto type = relevantTypes[i];
        o << U32LEB(indexedTypes.indices[type]);
        std::unordered_map<Index, Name>& fieldNames =
          wasm->typeNames.at(type).fieldNames;
        o << U32LEB(fieldNames.size());
        for (auto& [index, name] : fieldNames) {
          o << U32LEB(index);
          writeEscapedName(name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  // tag names
  if (!wasm->tags.empty()) {
    Index count = 0;
    for (auto& tag : wasm->tags) {
      if (tag->hasExplicitName) {
        count++;
      }
    }

    if (count) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameTag);
      o << U32LEB(count);
      for (Index i = 0; i < wasm->tags.size(); i++) {
        auto& tag = wasm->tags[i];
        if (tag->hasExplicitName) {
          o << U32LEB(i);
          writeEscapedName(tag->name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  finishSection(start);
}